

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O2

void __thiscall
glslang::TBuiltIns::addQueryFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  TString *this_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_02;
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  short sVar6;
  uint uVar7;
  ushort uVar8;
  int iVar9;
  char local_e8;
  pool_allocator<char> local_98;
  pool_allocator<char> local_90;
  TString funcName [2];
  
  bVar2 = sampler._1_1_;
  if (((((uint)sampler >> 0x13 & 1) != 0) && ((short)((uint)sampler & 0xff00) != 0x700)) &&
     (((uint)sampler & 0xff00) != 0x800)) {
    if (version < 0x136 && profile == EEsProfile) {
      return;
    }
    if (version < 0x1a4 && profile != EEsProfile) {
      return;
    }
  }
  iVar9 = (this->dimMap[bVar2] + (uint)(((uint)sampler >> 0x10 & 1) != 0)) - (uint)(bVar2 == 4);
  if (profile == EEsProfile) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(this->super_TBuiltInParseables).commonBuiltins,"highp ");
  }
  this_00 = &(this->super_TBuiltInParseables).commonBuiltins;
  if (iVar9 == 1) {
    pcVar5 = "int";
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"ivec");
    pcVar5 = this->postfixes[iVar9];
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,pcVar5);
  uVar8 = sampler._0_2_ - 0x700;
  pcVar5 = " imageSize(readonly writeonly volatile coherent nontemporal ";
  if (uVar8 < 0x200) {
    pcVar5 = " textureSize(";
  }
  if (((uint)sampler >> 0x13 & 1) == 0) {
    pcVar5 = " textureSize(";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,pcVar5);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,typeName);
  uVar7 = (uint)sampler & 0xff00;
  sVar6 = (short)uVar7;
  if (((uint)sampler >> 0x13 & 1) == 0) {
    if ((sVar6 != 0x500) && (uVar7 != 0x600)) {
LAB_003f2dca:
      if (((uint)sampler >> 0x12 & 1) == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_00,",int);\n");
        uVar4 = 0;
        goto LAB_003f2e01;
      }
    }
  }
  else if ((sVar6 == 0x700) || (uVar7 == 0x800)) goto LAB_003f2dca;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (this_00,");\n");
  uVar4 = (uint)sampler & 0x40000;
LAB_003f2e01:
  if (uVar4 != 0 && (0x1ad < version && profile != EEsProfile)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"int ");
    pcVar5 = "imageSamples(readonly writeonly volatile coherent nontemporal ";
    if (uVar8 < 0x200) {
      pcVar5 = "textureSamples(";
    }
    if (((uint)sampler >> 0x13 & 1) == 0) {
      pcVar5 = "textureSamples(";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,pcVar5);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,typeName);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,");\n");
  }
  if ((((0x95 < version && profile != EEsProfile) && ((uint)sampler & 0x140000) == 0x100000) &&
      (sVar6 != 0x500)) && (uVar7 != 0x600)) {
    local_90.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)funcName,
               "vec2 textureQueryLod(",&local_90);
    local_98.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
               (funcName + 1),"vec2 textureQueryLOD(",&local_98);
    local_e8 = sampler._0_1_;
    this_01 = (this->super_TBuiltInParseables).stageBuiltins + 4;
    this_02 = (this->super_TBuiltInParseables).stageBuiltins + 5;
    for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
      iVar9 = 2;
      while (iVar3 = iVar9, iVar3 != 0) {
        iVar9 = iVar3 + -1;
        if (local_e8 == '\x03' || iVar3 == 2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_01,funcName + lVar1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_01,typeName);
          if (this->dimMap[bVar2] == 1) {
            if (iVar3 == 2) {
              pcVar5 = ", float";
            }
            else {
              pcVar5 = ", float16_t";
            }
          }
          else {
            pcVar5 = ", f16vec";
            if (iVar3 == 2) {
              pcVar5 = ", vec";
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(this_01,pcVar5);
            pcVar5 = this->postfixes[this->dimMap[bVar2]];
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_01,pcVar5);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(this_01,");\n");
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_02,funcName + lVar1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_02,typeName);
      if (this->dimMap[bVar2] == 1) {
        pcVar5 = ", float";
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(this_02,", vec");
        pcVar5 = this->postfixes[this->dimMap[bVar2]];
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_02,pcVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(this_02,");\n");
    }
  }
  if (((0x1ad < version && profile != EEsProfile) &&
      ((((((uint)sampler >> 0x13 & 1) == 0 || (sVar6 == 0x800)) || (uVar7 == 0x700)) &&
       ((uVar4 == 0 && (sVar6 != 0x500)))))) && (uVar7 != 0x600)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,"int textureQueryLevels(");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,typeName);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (this_00,");\n");
  }
  return;
}

Assistant:

void TBuiltIns::addQueryFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    //
    // textureSize() and imageSize()
    //

    int sizeDims = dimMap[sampler.dim] + (sampler.arrayed ? 1 : 0) - (sampler.dim == EsdCube ? 1 : 0);

    if (sampler.isImage() && ((profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 420)))
        return;

    if (profile == EEsProfile)
        commonBuiltins.append("highp ");
    if (sizeDims == 1)
        commonBuiltins.append("int");
    else {
        commonBuiltins.append("ivec");
        commonBuiltins.append(postfixes[sizeDims]);
    }
    if (sampler.isImage())
        commonBuiltins.append(" imageSize(readonly writeonly volatile coherent nontemporal ");
    else
        commonBuiltins.append(" textureSize(");
    commonBuiltins.append(typeName);
    if (! sampler.isImage() && ! sampler.isRect() && ! sampler.isBuffer() && ! sampler.isMultiSample())
        commonBuiltins.append(",int);\n");
    else
        commonBuiltins.append(");\n");

    //
    // textureSamples() and imageSamples()
    //

    // GL_ARB_shader_texture_image_samples
    // TODO: spec issue? there are no memory qualifiers; how to query a writeonly/readonly image, etc?
    if (profile != EEsProfile && version >= 430 && sampler.isMultiSample()) {
        commonBuiltins.append("int ");
        if (sampler.isImage())
            commonBuiltins.append("imageSamples(readonly writeonly volatile coherent nontemporal ");
        else
            commonBuiltins.append("textureSamples(");
        commonBuiltins.append(typeName);
        commonBuiltins.append(");\n");
    }

    //
    // textureQueryLod(), fragment stage only
    // Also enabled with extension GL_ARB_texture_query_lod
    // Extension GL_ARB_texture_query_lod says that textureQueryLOD() also exist at extension.

    if (profile != EEsProfile && version >= 150 && sampler.isCombined() && sampler.dim != EsdRect &&
        ! sampler.isMultiSample() && ! sampler.isBuffer()) {

        const TString funcName[2] = {"vec2 textureQueryLod(", "vec2 textureQueryLOD("};

        for (int i = 0; i < 2; ++i){
            for (int f16TexAddr = 0; f16TexAddr < 2; ++f16TexAddr) {
                if (f16TexAddr && sampler.type != EbtFloat16)
                    continue;
                stageBuiltins[EShLangFragment].append(funcName[i]);
                stageBuiltins[EShLangFragment].append(typeName);
                if (dimMap[sampler.dim] == 1)
                    if (f16TexAddr)
                        stageBuiltins[EShLangFragment].append(", float16_t");
                    else
                        stageBuiltins[EShLangFragment].append(", float");
                else {
                    if (f16TexAddr)
                        stageBuiltins[EShLangFragment].append(", f16vec");
                    else
                        stageBuiltins[EShLangFragment].append(", vec");
                    stageBuiltins[EShLangFragment].append(postfixes[dimMap[sampler.dim]]);
                }
                stageBuiltins[EShLangFragment].append(");\n");
            }

            stageBuiltins[EShLangCompute].append(funcName[i]);
            stageBuiltins[EShLangCompute].append(typeName);
            if (dimMap[sampler.dim] == 1)
                stageBuiltins[EShLangCompute].append(", float");
            else {
                stageBuiltins[EShLangCompute].append(", vec");
                stageBuiltins[EShLangCompute].append(postfixes[dimMap[sampler.dim]]);
            }
            stageBuiltins[EShLangCompute].append(");\n");
        }
    }

    //
    // textureQueryLevels()
    //

    if (profile != EEsProfile && version >= 430 && ! sampler.isImage() && sampler.dim != EsdRect &&
        ! sampler.isMultiSample() && ! sampler.isBuffer()) {
        commonBuiltins.append("int textureQueryLevels(");
        commonBuiltins.append(typeName);
        commonBuiltins.append(");\n");
    }
}